

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

_Bool read_word(m680x_info *info,uint16_t *word,uint16_t address)

{
  bool bVar1;
  uint16_t address_local;
  uint16_t *word_local;
  m680x_info *info_local;
  
  bVar1 = (address + 1) - (uint)info->offset < info->size;
  if (bVar1) {
    *word = (ushort)info->code[(int)((uint)address - (uint)info->offset)] << 8;
    *word = *word | (ushort)info->code[(int)((address + 1) - (uint)info->offset)];
  }
  return bVar1;
}

Assistant:

static bool read_word(const m680x_info *info, uint16_t *word, uint16_t address)
{
	if (address + 1 - info->offset >= info->size)
		// out of code buffer range
		return false;

	*word = (uint16_t)info->code[address - info->offset] << 8;
	*word |= (uint16_t)info->code[address + 1 - info->offset];

	return true;
}